

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O1

void TorControlConnection::eventcb(bufferevent *bev,short what,void *ctx)

{
  long lVar1;
  bool bVar2;
  Logger *pLVar3;
  char *fmt;
  long lVar4;
  void *pvVar5;
  int source_line;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char)what < '\0') {
    pLVar3 = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar3,TOR,Debug);
    if (bVar2) {
      logging_function._M_str = "eventcb";
      logging_function._M_len = 7;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file._M_len = 0x57;
      ::LogPrintf_<>(logging_function,source_file,0x84,TOR,Debug,"Successfully connected!\n");
    }
    lVar4 = 0x18;
    pvVar5 = ctx;
    if (*(long *)((long)ctx + 0x10) == 0) goto LAB_003d1045;
  }
  else {
    if ((what & 0x30U) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      goto LAB_003d1059;
    }
    pLVar3 = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar3,TOR,Debug);
    if ((what & 0x20U) == 0) {
      if (bVar2) {
        fmt = "End of stream\n";
        source_line = 0x8a;
LAB_003d0ff5:
        logging_function_00._M_str = "eventcb";
        logging_function_00._M_len = 7;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_00._M_len = 0x57;
        ::LogPrintf_<>(logging_function_00,source_file_00,source_line,TOR,Debug,fmt);
      }
    }
    else if (bVar2) {
      fmt = "Error connecting to Tor control socket\n";
      source_line = 0x88;
      goto LAB_003d0ff5;
    }
    if (*(long *)((long)ctx + 0x48) != 0) {
      bufferevent_free();
    }
    *(undefined8 *)((long)ctx + 0x48) = 0;
    if (*(long *)((long)ctx + 0x30) == 0) {
LAB_003d1045:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_function_call();
      }
      goto LAB_003d1059;
    }
    lVar4 = 0x38;
    pvVar5 = (void *)((long)ctx + 0x20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (**(code **)((long)ctx + lVar4))(pvVar5,ctx);
    return;
  }
LAB_003d1059:
  __stack_chk_fail();
}

Assistant:

void TorControlConnection::eventcb(struct bufferevent *bev, short what, void *ctx)
{
    TorControlConnection *self = static_cast<TorControlConnection*>(ctx);
    if (what & BEV_EVENT_CONNECTED) {
        LogDebug(BCLog::TOR, "Successfully connected!\n");
        self->connected(*self);
    } else if (what & (BEV_EVENT_EOF|BEV_EVENT_ERROR)) {
        if (what & BEV_EVENT_ERROR) {
            LogDebug(BCLog::TOR, "Error connecting to Tor control socket\n");
        } else {
            LogDebug(BCLog::TOR, "End of stream\n");
        }
        self->Disconnect();
        self->disconnected(*self);
    }
}